

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PointerAnalysisFS.h
# Opt level: O0

bool dg::pta::PointerAnalysisFS::canChangeMM(PSNode *n)

{
  PSNodeType PVar1;
  PSNode *this;
  PSNode *in_RDI;
  bool local_1;
  
  PVar1 = PSNode::getType(in_RDI);
  switch(PVar1) {
  case STORE:
  case CALL_FUNCPTR:
  case MEMCPY:
    local_1 = true;
    break;
  default:
    local_1 = false;
    break;
  case CALL_RETURN:
    this = PSNode::getPairedNode(in_RDI);
    PVar1 = PSNode::getType(this);
    local_1 = PVar1 == CALL_FUNCPTR;
  }
  return local_1;
}

Assistant:

static bool canChangeMM(PSNode *n) {
        switch (n->getType()) {
        case PSNodeType::STORE:
        case PSNodeType::MEMCPY:
        case PSNodeType::CALL_FUNCPTR:
            // a call via function pointer needs to
            // have its own memory map as we dont know
            // how the graph will look like after the
            // call yet
            return true;
        case PSNodeType::CALL_RETURN:
            // return from function that was called via function
            // pointer must have its own memory map from the
            // same reason why CALL_FUNCPTR nodes need its
            // own memory map
            assert(n->getPairedNode());
            return n->getPairedNode()->getType() == PSNodeType::CALL_FUNCPTR;
        default:
            return false;
        }

        return false;
    }